

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::ClosePendingScriptContexts(ThreadContext *this)

{
  ScriptContext *pSVar1;
  ScriptContext *nextScriptContext;
  ScriptContext *scriptContext;
  ThreadContext *this_local;
  
  nextScriptContext = this->rootPendingClose;
  if (nextScriptContext != (ScriptContext *)0x0) {
    do {
      pSVar1 = Js::ScriptContext::GetNextPendingClose(nextScriptContext);
      Js::ScriptContext::Close(nextScriptContext,false);
      nextScriptContext = pSVar1;
    } while (pSVar1 != (ScriptContext *)0x0);
    this->rootPendingClose = (ScriptContext *)0x0;
  }
  return;
}

Assistant:

void ThreadContext::ClosePendingScriptContexts()
{
    Js::ScriptContext * scriptContext = rootPendingClose;
    if (scriptContext == nullptr)
    {
        return;
    }
    Js::ScriptContext * nextScriptContext;
    do
    {
        nextScriptContext = scriptContext->GetNextPendingClose();
        scriptContext->Close(false);
        scriptContext = nextScriptContext;
    }
    while (scriptContext);
    rootPendingClose = nullptr;
}